

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamRedirect::StreamRedirect(StreamRedirect *this,ostream *stream,string *targetString)

{
  this->m_stream = stream;
  this->m_prevBuf = *(streambuf **)(stream + *(long *)(*(long *)stream + -0x18) + 0xe8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_oss);
  this->m_targetString = targetString;
  std::ios::rdbuf((streambuf *)(stream + *(long *)(*(long *)stream + -0x18)));
  return;
}

Assistant:

StreamRedirect( std::ostream& stream, std::string& targetString )
        :   m_stream( stream ),
            m_prevBuf( stream.rdbuf() ),
            m_targetString( targetString )
        {
            stream.rdbuf( m_oss.rdbuf() );
        }